

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O2

Name __thiscall
wasm::anon_unknown_18::getGlobalElem(anon_unknown_18 *this,Module *module,Name global,Index i)

{
  char **__return_storage_ptr__;
  IString IVar1;
  undefined1 local_c0 [8];
  Name global_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string_view local_30;
  
  global_local.super_IString.str._M_len = global.super_IString.str._M_len;
  __return_storage_ptr__ = &global_local.super_IString.str._M_str;
  local_c0 = (undefined1  [8])module;
  IString::toString_abi_cxx11_((string *)__return_storage_ptr__,(IString *)local_c0);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,'$');
  std::__cxx11::to_string(&local_50,(uint)global.super_IString.str._M_str);
  std::operator+(&local_90,&local_70,&local_50);
  IString::IString((IString *)&local_30,&local_90);
  IVar1.str = (string_view)Names::getValidGlobalName((Module *)this,local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&global_local.super_IString.str._M_str);
  return (IString)(IString)IVar1.str;
}

Assistant:

Name getGlobalElem(Module* module, Name global, Index i) {
  return Names::getValidGlobalName(*module,
                                   global.toString() + '$' + std::to_string(i));
}